

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SetIssuance_Test::TestBody(ConfidentialTransaction_SetIssuance_Test *this)

{
  ByteData256 BVar1;
  ByteData256 BVar2;
  ConfidentialValue CVar3;
  ConfidentialValue CVar4;
  bool bVar5;
  char *pcVar6;
  AssertionResult gtest_ar_2;
  AssertHelper local_408;
  pointer puStack_400;
  undefined1 in_stack_fffffffffffffc08 [16];
  AssertHelper in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc20 [16];
  undefined8 uStack_3d0;
  AssertionResult gtest_ar;
  undefined1 auStack_3b8 [16];
  _Vector_impl_data in_stack_fffffffffffffc58;
  _Vector_impl_data in_stack_fffffffffffffc70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_268;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_220;
  ConfidentialValue local_208;
  ConfidentialValue local_1e0;
  ConfidentialTransaction tx;
  ConfidentialTxInReference txin;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,(string *)&exp_tx_hex_abi_cxx11_);
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      cfd::core::ConfidentialTransaction::AddTxIn
                ((Txid *)&tx,0x469f10,2,(Script *)0xfffffffffffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin);
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_250,
                 &exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_268,
                 &exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1e0,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_208,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220,
                 &exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238,
                 &exp_inflation_keys_rangeproof.data_);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_238;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_220;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = gtest_ar_2.success_;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = gtest_ar_2._1_7_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = (uint32_t)local_408.data_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)gtest_ar_2.message_.ptr_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = local_408.data_._4_4_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puStack_400;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc18.data_;
      CVar3._vptr_ConfidentialValue = (_func_int **)in_stack_fffffffffffffc08._0_8_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc08._8_8_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc20._0_8_;
      CVar3.version_ = in_stack_fffffffffffffc20[8];
      CVar3._33_7_ = in_stack_fffffffffffffc20._9_7_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = gtest_ar.success_;
      CVar4._vptr_ConfidentialValue = (_func_int **)uStack_3d0;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ = gtest_ar._1_7_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      CVar4._24_16_ = auStack_3b8;
      cfd::core::ConfidentialTransaction::SetIssuance
                ((uint)&tx,BVar1,BVar2,CVar3,CVar4,(ByteData)in_stack_fffffffffffffc58,
                 (ByteData)in_stack_fffffffffffffc70);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_238);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_220);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_208);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_1e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_250);
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x105,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin);
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin);
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)&gtest_ar);
      cfd::core::ConfidentialTxInReference::operator=(&txin,(ConfidentialTxInReference *)&gtest_ar);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x108,
               "Expected: (txin = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_408.data_._0_4_ = txin.super_AbstractTxInReference.vout_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&local_408,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_408);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10a,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc18,(Message *)&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_408);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_408.data_._0_4_ = txin.super_AbstractTxInReference.sequence_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",(uint *)&local_408,
             &exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_408);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10b,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc18,(Message *)&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_408);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Txid::Txid((Txid *)&local_408,&txin.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar6,(char *)in_stack_fffffffffffffc18.data_);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&local_408);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::Script::Script((Script *)&gtest_ar,&txin.super_AbstractTxInReference.unlocking_script_)
  ;
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar6,(char *)in_stack_fffffffffffffc18.data_);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  std::__cxx11::string::~string((string *)&local_408);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18,
             &txin.blinding_nonce_.data_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar6,
             (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_));
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x110,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18,
             &txin.asset_entropy_.data_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar6,
             (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_));
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x112,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar6,(char *)in_stack_fffffffffffffc18.data_);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  std::__cxx11::string::~string((string *)&local_408);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x114,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar6,(char *)in_stack_fffffffffffffc18.data_);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
  std::__cxx11::string::~string((string *)&local_408);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x116,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18,
             &txin.issuance_amount_rangeproof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar6 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar6,
             (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_));
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x118,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18,
             &txin.inflation_keys_rangeproof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             (char *)CONCAT44(local_408.data_._4_4_,(uint32_t)local_408.data_));
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffc18
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_408,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetIssuance) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));

  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));

  ConfidentialTxInReference txin;
  EXPECT_NO_THROW((txin = tx.GetTxIn(1)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
               exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
               exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
               exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
               exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
               exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
               exp_inflation_keys_rangeproof.GetHex().c_str());
}